

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_value * jx9_new_scalar(jx9_vm *pVm)

{
  jx9_value *pObj;
  
  if (((pVm != (jx9_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) &&
     (pObj = (jx9_value *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x40), pObj != (jx9_value *)0x0)) {
    jx9MemObjInit(pVm,pObj);
    return pObj;
  }
  return (jx9_value *)0x0;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_new_scalar(jx9_vm *pVm)
{
	jx9_value *pObj;
	/* Ticket 1433-002: NULL VM is harmless operation */
	if ( JX9_VM_MISUSE(pVm) ){
		return 0;
	}
	/* Allocate a new scalar variable */
	pObj = (jx9_value *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_value));
	if( pObj == 0 ){
		return 0;
	}
	/* Nullify the new scalar */
	jx9MemObjInit(pVm, pObj);
	return pObj;
}